

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessTexturesTests.cpp
# Opt level: O1

bool __thiscall
gl4cts::DirectStateAccess::Textures::CompressedSubImageTest::CheckData
          (CompressedSubImageTest *this,GLenum target,GLenum internalformat)

{
  long lVar1;
  ostringstream *this_00;
  uint uVar2;
  long lVar3;
  long lVar4;
  int iVar5;
  deUint32 err;
  undefined4 extraout_var;
  GLubyte *pGVar6;
  char *pcVar7;
  long lVar8;
  bool bVar9;
  string local_208;
  string local_1e8;
  Enum<int,_2UL> local_1c8;
  Enum<int,_2UL> local_1b8;
  undefined1 local_1a8 [120];
  ios_base local_130 [264];
  
  iVar5 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  pGVar6 = (GLubyte *)operator_new__((ulong)this->m_reference_size);
  this->m_result = pGVar6;
  (**(code **)(CONCAT44(extraout_var,iVar5) + 0x7c8))(target,0,pGVar6);
  err = (**(code **)(CONCAT44(extraout_var,iVar5) + 0x800))();
  glu::checkError(err,"glGetCompressedTexImage has failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                  ,0x12b2);
  uVar2 = this->m_reference_size;
  bVar9 = uVar2 == 0;
  if (!bVar9) {
    if (*this->m_reference == *this->m_result) {
      lVar8 = 0;
      do {
        if (uVar2 - 1 == (int)lVar8) {
          return true;
        }
        lVar3 = lVar8 + 1;
        lVar1 = lVar8 + 1;
        lVar4 = lVar8 + 1;
        lVar8 = lVar1;
      } while (this->m_reference[lVar3] == this->m_result[lVar4]);
      bVar9 = uVar2 <= (uint)lVar1;
    }
    local_1a8._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
    this_00 = (ostringstream *)(local_1a8 + 8);
    std::__cxx11::ostringstream::ostringstream(this_00);
    pcVar7 = "glCompressedTextureSubImage*D created texture with data ";
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)this_00,"glCompressedTextureSubImage*D created texture with data ",0x38);
    DataToString_abi_cxx11_
              (&local_1e8,(CompressedSubImageTest *)pcVar7,this->m_reference_size,this->m_reference)
    ;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)this_00,local_1e8._M_dataplus._M_p,local_1e8._M_string_length);
    pcVar7 = " however texture contains data ";
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)this_00," however texture contains data ",0x1f);
    DataToString_abi_cxx11_
              (&local_208,(CompressedSubImageTest *)pcVar7,this->m_reference_size,this->m_result);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)this_00,local_208._M_dataplus._M_p,local_208._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)this_00,". Texture target was ",0x15);
    local_1b8.m_getName = glu::getTextureTargetName;
    local_1b8.m_value = target;
    tcu::Format::Enum<int,_2UL>::toStream(&local_1b8,(ostream *)this_00);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)this_00," and internal format was ",0x19);
    local_1c8.m_getName = glu::getTextureFormatName;
    local_1c8.m_value = internalformat;
    tcu::Format::Enum<int,_2UL>::toStream(&local_1c8,(ostream *)this_00);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,". Test fails.",0xd);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_208._M_dataplus._M_p != &local_208.field_2) {
      operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
      operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream(this_00);
    std::ios_base::~ios_base(local_130);
  }
  return bVar9;
}

Assistant:

bool CompressedSubImageTest::CheckData(glw::GLenum target, glw::GLenum internalformat)
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Check texture content with reference. */
	m_result = new glw::GLubyte[m_reference_size];

	if (DE_NULL == m_result)
	{
		throw 0;
	}

	gl.getCompressedTexImage(target, 0, m_result);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetCompressedTexImage has failed");

	for (glw::GLuint i = 0; i < m_reference_size; ++i)
	{
		if (m_reference[i] != m_result[i])
		{
			m_context.getTestContext().getLog()
				<< tcu::TestLog::Message << "glCompressedTextureSubImage*D created texture with data "
				<< DataToString(m_reference_size, m_reference) << " however texture contains data "
				<< DataToString(m_reference_size, m_result) << ". Texture target was "
				<< glu::getTextureTargetStr(target) << " and internal format was "
				<< glu::getTextureFormatStr(internalformat) << ". Test fails." << tcu::TestLog::EndMessage;

			return false;
		}
	}

	return true;
}